

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gram.c
# Opt level: O2

void plus_EBNF(Grammar *g)

{
  anon_struct_40_4_d8687ec6_for_rules *v;
  uint uVar1;
  Elem *e;
  Elem **ppEVar2;
  Rule **ppRVar3;
  Elem **ppEVar4;
  AssocKind AVar5;
  int iVar6;
  Production *p;
  Rule *pRVar7;
  Elem *pEVar8;
  anon_struct_40_4_d8687ec6_for_elems *paVar9;
  Rule **ppRVar10;
  
  p = new_internal_production(g,g->p);
  p->field_0x3c = p->field_0x3c & 0xe3 | 0x10;
  pRVar7 = new_rule(g,p);
  paVar9 = &pRVar7->elems;
  e = (g->r->elems).v[(g->r->elems).n - 1];
  ppEVar2 = (pRVar7->elems).v;
  if (g->right_recursive_BNF == 0) {
    if (ppEVar2 == (Elem **)0x0) {
      pEVar8 = new_elem_nterm(p,pRVar7);
      (pRVar7->elems).v = (pRVar7->elems).e;
      uVar1 = (pRVar7->elems).n;
      (pRVar7->elems).n = uVar1 + 1;
      (pRVar7->elems).e[uVar1] = pEVar8;
    }
    else {
      uVar1 = (pRVar7->elems).n;
      if (ppEVar2 == (pRVar7->elems).e) {
        if (2 < uVar1) goto LAB_0013aeb7;
      }
      else if ((uVar1 & 7) == 0) {
LAB_0013aeb7:
        pEVar8 = new_elem_nterm(p,pRVar7);
        vec_add_internal(paVar9,pEVar8);
        goto LAB_0013aecd;
      }
      pEVar8 = new_elem_nterm(p,pRVar7);
      uVar1 = (pRVar7->elems).n;
      (pRVar7->elems).n = uVar1 + 1;
      (pRVar7->elems).v[uVar1] = pEVar8;
    }
LAB_0013aecd:
    ppEVar2 = (pRVar7->elems).v;
    if (ppEVar2 == (Elem **)0x0) {
      pEVar8 = dup_elem(e,pRVar7);
      (pRVar7->elems).v = (pRVar7->elems).e;
      uVar1 = (pRVar7->elems).n;
      (pRVar7->elems).n = uVar1 + 1;
      (pRVar7->elems).e[uVar1] = pEVar8;
    }
    else {
      uVar1 = (pRVar7->elems).n;
      if (ppEVar2 == (pRVar7->elems).e) {
        if (2 < uVar1) goto LAB_0013af38;
      }
      else if ((uVar1 & 7) == 0) {
LAB_0013af38:
        pEVar8 = dup_elem(e,pRVar7);
        vec_add_internal(paVar9,pEVar8);
        goto LAB_0013af4e;
      }
      pEVar8 = dup_elem(e,pRVar7);
      uVar1 = (pRVar7->elems).n;
      (pRVar7->elems).n = uVar1 + 1;
      (pRVar7->elems).v[uVar1] = pEVar8;
    }
LAB_0013af4e:
    pEVar8 = new_elem_nterm(p,g->r);
    (g->r->elems).v[(g->r->elems).n - 1] = pEVar8;
    iVar6 = g->r->rule_priority;
    if (iVar6 != 0) {
      AVar5 = ASSOC_NARY_LEFT;
      goto LAB_0013af84;
    }
  }
  else {
    if (ppEVar2 == (Elem **)0x0) {
      pEVar8 = dup_elem(e,pRVar7);
      (pRVar7->elems).v = (pRVar7->elems).e;
      uVar1 = (pRVar7->elems).n;
      (pRVar7->elems).n = uVar1 + 1;
      (pRVar7->elems).e[uVar1] = pEVar8;
    }
    else {
      uVar1 = (pRVar7->elems).n;
      if (ppEVar2 == (pRVar7->elems).e) {
        if (2 < uVar1) goto LAB_0013adb3;
      }
      else if ((uVar1 & 7) == 0) {
LAB_0013adb3:
        pEVar8 = dup_elem(e,pRVar7);
        vec_add_internal(paVar9,pEVar8);
        goto LAB_0013adc9;
      }
      pEVar8 = dup_elem(e,pRVar7);
      uVar1 = (pRVar7->elems).n;
      (pRVar7->elems).n = uVar1 + 1;
      (pRVar7->elems).v[uVar1] = pEVar8;
    }
LAB_0013adc9:
    pEVar8 = new_elem_nterm(p,g->r);
    (g->r->elems).v[(g->r->elems).n - 1] = pEVar8;
    ppEVar2 = (pRVar7->elems).v;
    if (ppEVar2 == (Elem **)0x0) {
      pEVar8 = new_elem_nterm(p,pRVar7);
      (pRVar7->elems).v = (pRVar7->elems).e;
      uVar1 = (pRVar7->elems).n;
      (pRVar7->elems).n = uVar1 + 1;
      (pRVar7->elems).e[uVar1] = pEVar8;
    }
    else {
      uVar1 = (pRVar7->elems).n;
      if (ppEVar2 == (pRVar7->elems).e) {
        if (2 < uVar1) goto LAB_0013ae59;
      }
      else if ((uVar1 & 7) == 0) {
LAB_0013ae59:
        pEVar8 = new_elem_nterm(p,pRVar7);
        vec_add_internal(paVar9,pEVar8);
        goto LAB_0013ae6f;
      }
      pEVar8 = new_elem_nterm(p,pRVar7);
      uVar1 = (pRVar7->elems).n;
      (pRVar7->elems).n = uVar1 + 1;
      (pRVar7->elems).v[uVar1] = pEVar8;
    }
LAB_0013ae6f:
    iVar6 = g->r->rule_priority;
    if (iVar6 != 0) {
      AVar5 = ASSOC_NARY_RIGHT;
LAB_0013af84:
      pRVar7->rule_priority = iVar6;
      pRVar7->rule_assoc = AVar5;
    }
  }
  v = &p->rules;
  ppRVar3 = (p->rules).v;
  ppRVar10 = (p->rules).e;
  if (ppRVar3 == (Rule **)0x0) {
    (p->rules).v = ppRVar10;
    uVar1 = (p->rules).n;
    (p->rules).n = uVar1 + 1;
    (p->rules).e[uVar1] = pRVar7;
  }
  else {
    uVar1 = v->n;
    if (ppRVar3 == ppRVar10) {
      if (2 < uVar1) goto LAB_0013afd6;
    }
    else if ((uVar1 & 7) == 0) {
LAB_0013afd6:
      vec_add_internal(v,pRVar7);
      goto LAB_0013afe1;
    }
    v->n = uVar1 + 1;
    ppRVar3[uVar1] = pRVar7;
  }
LAB_0013afe1:
  pRVar7 = new_rule(g,p);
  ppEVar4 = (pRVar7->elems).v;
  ppEVar2 = (pRVar7->elems).e;
  if (ppEVar4 == (Elem **)0x0) {
    (pRVar7->elems).v = ppEVar2;
    uVar1 = (pRVar7->elems).n;
    (pRVar7->elems).n = uVar1 + 1;
    (pRVar7->elems).e[uVar1] = e;
  }
  else {
    paVar9 = &pRVar7->elems;
    uVar1 = paVar9->n;
    if (ppEVar4 == ppEVar2) {
      if (2 < uVar1) goto LAB_0013b03f;
    }
    else if ((uVar1 & 7) == 0) {
LAB_0013b03f:
      vec_add_internal(paVar9,e);
      goto LAB_0013b047;
    }
    paVar9->n = uVar1 + 1;
    ppEVar4[uVar1] = e;
  }
LAB_0013b047:
  e->rule = pRVar7;
  ppRVar3 = (p->rules).v;
  if (ppRVar3 == (Rule **)0x0) {
    (p->rules).v = ppRVar10;
    uVar1 = (p->rules).n;
    (p->rules).n = uVar1 + 1;
    (p->rules).e[uVar1] = pRVar7;
  }
  else {
    uVar1 = v->n;
    if (ppRVar3 == ppRVar10) {
      if (2 < uVar1) goto LAB_0013b099;
    }
    else if ((uVar1 & 7) == 0) {
LAB_0013b099:
      vec_add_internal(v,pRVar7);
      return;
    }
    v->n = uVar1 + 1;
    ppRVar3[uVar1] = pRVar7;
  }
  return;
}

Assistant:

void plus_EBNF(Grammar *g) {
  Production *pp;
  Rule *rr;
  Elem *elem;

  pp = new_internal_production(g, g->p);
  pp->internal = INTERNAL_PLUS;
  rr = new_rule(g, pp);
  if (!g->right_recursive_BNF) {
    elem = last_elem(g->r);
    vec_add(&rr->elems, new_elem_nterm(pp, rr));
    vec_add(&rr->elems, dup_elem(elem, rr));
    last_elem(g->r) = new_elem_nterm(pp, g->r);
    if (g->r->rule_priority) {
      rr->rule_priority = g->r->rule_priority;
      rr->rule_assoc = ASSOC_NARY_LEFT;
    }
  } else {
    elem = last_elem(g->r);
    vec_add(&rr->elems, dup_elem(elem, rr));
    last_elem(g->r) = new_elem_nterm(pp, g->r);
    vec_add(&rr->elems, new_elem_nterm(pp, rr));
    if (g->r->rule_priority) {
      rr->rule_priority = g->r->rule_priority;
      rr->rule_assoc = ASSOC_NARY_RIGHT;
    }
  }
  vec_add(&pp->rules, rr);
  rr = new_rule(g, pp);
  vec_add(&rr->elems, elem);
  elem->rule = rr;
  vec_add(&pp->rules, rr);
}